

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_system_linux.c
# Opt level: O1

int os_system_linux_linux_get_ioctl_fd(int af_type)

{
  int iVar1;
  
  iVar1 = _ioctl_v6;
  if ((af_type != 10) && (iVar1 = -1, af_type == 2)) {
    return _ioctl_v4;
  }
  return iVar1;
}

Assistant:

int
os_system_linux_linux_get_ioctl_fd(int af_type) {
  switch (af_type) {
    case AF_INET:
      return _ioctl_v4;
    case AF_INET6:
      return _ioctl_v6;
    default:
      return -1;
  }
}